

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel_list.c
# Opt level: O3

exr_result_t
exr_attr_chlist_duplicate(exr_context_t ctxt,exr_attr_chlist_t *chl,exr_attr_chlist_t *srcchl)

{
  uint nchans;
  exr_attr_chlist_entry_t *peVar1;
  exr_result_t eVar2;
  long lVar3;
  
  eVar2 = 3;
  if (srcchl != (exr_attr_chlist_t *)0x0 && chl != (exr_attr_chlist_t *)0x0) {
    nchans = srcchl->num_channels;
    eVar2 = exr_attr_chlist_init(ctxt,chl,nchans);
    if (eVar2 == 0) {
      if (0 < (int)nchans) {
        lVar3 = 0;
        do {
          peVar1 = srcchl->entries;
          eVar2 = exr_attr_chlist_add_with_length
                            (ctxt,chl,*(char **)(peVar1->reserved + lVar3 + -0xd),
                             *(int32_t *)(peVar1->reserved + lVar3 + -0x15),
                             *(exr_pixel_type_t *)(peVar1->reserved + lVar3 + -5),
                             (uint)peVar1->reserved[lVar3 + -1],
                             *(int32_t *)(peVar1->reserved + lVar3 + 3),
                             *(int32_t *)(peVar1->reserved + lVar3 + 7));
          if (eVar2 != 0) {
            exr_attr_chlist_destroy(ctxt,chl);
            return eVar2;
          }
          lVar3 = lVar3 + 0x20;
        } while ((ulong)nchans << 5 != lVar3);
      }
      eVar2 = 0;
    }
  }
  return eVar2;
}

Assistant:

exr_result_t
exr_attr_chlist_duplicate (
    exr_context_t ctxt, exr_attr_chlist_t* chl, const exr_attr_chlist_t* srcchl)
{
    exr_result_t rv;
    int          numchans;

    if (!chl || !srcchl) return EXR_ERR_INVALID_ARGUMENT;

    numchans = srcchl->num_channels;
    rv       = exr_attr_chlist_init (ctxt, chl, numchans);
    if (rv != EXR_ERR_SUCCESS) return rv;

    for (int c = 0; c < numchans; ++c)
    {
        const exr_attr_chlist_entry_t* cur = srcchl->entries + c;

        rv = exr_attr_chlist_add_with_length (
            ctxt,
            chl,
            cur->name.str,
            cur->name.length,
            cur->pixel_type,
            (exr_perceptual_treatment_t) cur->p_linear,
            cur->x_sampling,
            cur->y_sampling);
        if (rv != EXR_ERR_SUCCESS)
        {
            exr_attr_chlist_destroy (ctxt, chl);
            return rv;
        }
    }
    return rv;
}